

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_NodeSimulateSim(Ivy_FraigMan_t *p,Ivy_FraigSim_t *pSims)

{
  Ivy_FraigSim_t *pIVar1;
  Ivy_FraigSim_t *pIVar2;
  long lVar3;
  
  if ((uint)pSims->Type < 8) {
    pIVar1 = pSims->pFanin0;
    pIVar2 = pSims->pFanin1;
    switch(pSims->Type) {
    case 0:
      for (lVar3 = 0; lVar3 < p->nSimWords; lVar3 = lVar3 + 1) {
        (&pSims[1].Type)[lVar3] = (&pIVar2[1].Type)[lVar3] & (&pIVar1[1].Type)[lVar3];
      }
      break;
    case 1:
      for (lVar3 = 0; lVar3 < p->nSimWords; lVar3 = lVar3 + 1) {
        (&pSims[1].Type)[lVar3] = ~((&pIVar2[1].Type)[lVar3] & (&pIVar1[1].Type)[lVar3]);
      }
      break;
    case 2:
      for (lVar3 = 0; lVar3 < p->nSimWords; lVar3 = lVar3 + 1) {
        (&pSims[1].Type)[lVar3] = ~(&pIVar2[1].Type)[lVar3] & (&pIVar1[1].Type)[lVar3];
      }
      break;
    case 3:
      for (lVar3 = 0; lVar3 < p->nSimWords; lVar3 = lVar3 + 1) {
        (&pSims[1].Type)[lVar3] = ~(&pIVar1[1].Type)[lVar3] | (&pIVar2[1].Type)[lVar3];
      }
      break;
    case 4:
      for (lVar3 = 0; lVar3 < p->nSimWords; lVar3 = lVar3 + 1) {
        (&pSims[1].Type)[lVar3] = ~(&pIVar1[1].Type)[lVar3] & (&pIVar2[1].Type)[lVar3];
      }
      break;
    case 5:
      for (lVar3 = 0; lVar3 < p->nSimWords; lVar3 = lVar3 + 1) {
        (&pSims[1].Type)[lVar3] = ~(&pIVar2[1].Type)[lVar3] | (&pIVar1[1].Type)[lVar3];
      }
      break;
    case 6:
      for (lVar3 = 0; lVar3 < p->nSimWords; lVar3 = lVar3 + 1) {
        (&pSims[1].Type)[lVar3] = ~((&pIVar2[1].Type)[lVar3] | (&pIVar1[1].Type)[lVar3]);
      }
      break;
    case 7:
      for (lVar3 = 0; lVar3 < p->nSimWords; lVar3 = lVar3 + 1) {
        (&pSims[1].Type)[lVar3] = (&pIVar2[1].Type)[lVar3] | (&pIVar1[1].Type)[lVar3];
      }
    }
  }
  return;
}

Assistant:

void Ivy_NodeSimulateSim( Ivy_FraigMan_t * p, Ivy_FraigSim_t * pSims )
{
    unsigned * pData, * pData0, * pData1;
    int i;
    pData  = pSims->pData;
    pData0 = pSims->pFanin0->pData;
    pData1 = pSims->pFanin1->pData;
    switch( pSims->Type )
    {
    case 0:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (pData0[i] & pData1[i]);
        break;
    case 1:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = ~(pData0[i] & pData1[i]);
        break;
    case 2:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (pData0[i] & ~pData1[i]);
        break;
    case 3:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (~pData0[i] | pData1[i]);
        break;
    case 4:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (~pData0[i] & pData1[i]);
        break;
    case 5:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (pData0[i] | ~pData1[i]);
        break;
    case 6:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = ~(pData0[i] | pData1[i]);
        break;
    case 7:
        for ( i = 0; i < p->nSimWords; i++ )
            pData[i] = (pData0[i] | pData1[i]);
        break;
    }
}